

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectDeclaration_Variable.h
# Opt level: O2

void __thiscall
psy::C::VariableDeclarationSymbol::~VariableDeclarationSymbol(VariableDeclarationSymbol *this)

{
  ObjectDeclarationSymbol::~ObjectDeclarationSymbol(&this->super_ObjectDeclarationSymbol);
  operator_delete(this,0x20);
  return;
}

Assistant:

class PSY_C_API VariableDeclarationSymbol final : public ObjectDeclarationSymbol
{
public:
    //!@{
    /**
     * Cast \c this Symbol as a VariableDeclarationSymbol.
     */
    virtual VariableDeclarationSymbol* asVariableDeclaration() override { return this; }
    virtual const VariableDeclarationSymbol* asVariableDeclaration() const override { return this; }
    //!@}

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

    VariableDeclarationSymbol(
            const Symbol* containingSym,
            const SyntaxTree* tree,
            const Scope* enclosingScope);
}